

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimCountResults(Res_Sim_t *p,int *pnDcs,int *pnOnes,int *pnZeros,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  int local_44;
  int nTotal;
  int i;
  uchar *pInfoNode;
  uchar *pInfoCare;
  int fVerbose_local;
  int *pnZeros_local;
  int *pnOnes_local;
  int *pnDcs_local;
  Res_Sim_t *p_local;
  
  pVVar1 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,0);
  pvVar4 = Vec_PtrEntry(pVVar1,pAVar3->Id);
  pVVar1 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,1);
  pvVar5 = Vec_PtrEntry(pVVar1,pAVar3->Id);
  for (local_44 = 0; local_44 < p->nBytesIn; local_44 = local_44 + 1) {
    if (*(char *)((long)pvVar4 + (long)local_44) == '\0') {
      *pnDcs = *pnDcs + 1;
    }
    else if (*(char *)((long)pvVar5 + (long)local_44) == '\0') {
      *pnZeros = *pnZeros + 1;
    }
    else {
      *pnOnes = *pnOnes + 1;
    }
  }
  iVar2 = *pnOnes + *pnZeros + *pnDcs;
  if (fVerbose != 0) {
    printf("Dc = %7.2f %%  ",((double)*pnDcs * 100.0) / (double)iVar2);
    printf("On = %7.2f %%  ",((double)*pnOnes * 100.0) / (double)iVar2);
    printf("Off = %7.2f %%  ",((double)*pnZeros * 100.0) / (double)iVar2);
  }
  return;
}

Assistant:

void Res_SimCountResults( Res_Sim_t * p, int * pnDcs, int * pnOnes, int * pnZeros, int fVerbose )
{
    unsigned char * pInfoCare, * pInfoNode;
    int i, nTotal = 0;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        if ( !pInfoCare[i] )
            (*pnDcs)++;
        else if ( !pInfoNode[i] )
            (*pnZeros)++;
        else
            (*pnOnes)++;
    }
    nTotal += *pnDcs;
    nTotal += *pnZeros;
    nTotal += *pnOnes;
    if ( fVerbose )
    {
        printf( "Dc = %7.2f %%  ",  100.0*(*pnDcs)  /nTotal );
        printf( "On = %7.2f %%  ",  100.0*(*pnOnes) /nTotal );
        printf( "Off = %7.2f %%  ", 100.0*(*pnZeros)/nTotal );
    }
}